

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverAlternatingMaximization.h
# Opt level: O1

double __thiscall
BGIP_SolverAlternatingMaximization<JointPolicyPureVector>::ComputeBestResponse
          (BGIP_SolverAlternatingMaximization<JointPolicyPureVector> *this,
          JointPolicyPureVector *jpolBG,Index optimizingAgentI)

{
  int *piVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  sp_counted_base *psVar4;
  size_type __n;
  pointer pdVar5;
  element_type *this_00;
  int iVar6;
  Index jointI;
  uint uVar7;
  undefined4 extraout_var;
  size_t sVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  undefined4 extraout_var_00;
  pointer puVar9;
  undefined4 extraout_var_01;
  ulong uVar10;
  Index best_a;
  ulong uVar11;
  Index acI;
  ulong uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double v_t;
  vector<unsigned_int,_std::allocator<unsigned_int>_> types;
  vector<unsigned_int,_std::allocator<unsigned_int>_> avec;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  v;
  allocator_type local_aa;
  allocator_type local_a9;
  double local_a8;
  vector<double,_std::allocator<double>_> local_a0;
  ulong local_88;
  JointPolicyPureVector *local_80;
  double local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_58;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  psVar4 = (this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
           super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
           _m_referredBG.pn.pi_;
  local_58 = (this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
             super_BGIP_IncrementalSolverInterface.super_BayesianGameIdenticalPayoffSolver.
             _m_referredBG;
  auVar15 = ZEXT1664((undefined1  [16])local_58);
  if (psVar4 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar4->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  this_00 = local_58.px;
  uVar11 = (ulong)optimizingAgentI;
  puVar9 = (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)local_58.px + 0x98))->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_80 = jpolBG;
  if (uVar11 < (ulong)((long)(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              ((long)local_58.px + 0x98))->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 3)) {
    __n = puVar9[uVar11];
    iVar6 = (*((local_58.px)->super_BayesianGameBase).super_Interface_ProblemToPolicyDiscretePure.
              super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[4])
                      (local_58.px,(ulong)optimizingAgentI);
    local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_a0,CONCAT44(extraout_var,iVar6),(value_type_conflict3 *)&local_70,&local_a9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_48,__n,&local_a0,&local_aa);
    if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar10 = 0;
    local_88 = uVar11;
    while( true ) {
      sVar8 = BayesianGameBase::GetNrJointTypes(&this_00->super_BayesianGameBase);
      if (sVar8 <= uVar10) {
        puVar9 = (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)this_00 + 0x98))
                 ->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (uVar11 < (ulong)((long)(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                    ((long)this_00 + 0x98))->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 3))
        {
          dVar13 = 0.0;
          uVar10 = 0;
          do {
            local_78 = dVar13;
            if (puVar9[uVar11] <= uVar10) {
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector(&local_48);
              boost::detail::shared_count::~shared_count(&local_58.pn);
              return local_78;
            }
            uVar11 = 0;
            local_a8 = -1.79769313486232e+308;
            uVar12 = 0;
            while( true ) {
              iVar6 = (*(this_00->super_BayesianGameBase).
                        super_Interface_ProblemToPolicyDiscretePure.
                        super_Interface_ProblemToPolicyDiscrete.
                        _vptr_Interface_ProblemToPolicyDiscrete[4])(this_00,(ulong)optimizingAgentI)
              ;
              if (CONCAT44(extraout_var_01,iVar6) <= uVar12) break;
              dVar13 = local_48.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar10].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar12];
              auVar14._8_8_ = 0;
              auVar14._0_8_ = dVar13;
              auVar17._8_8_ = 0;
              auVar17._0_8_ = local_a8;
              auVar14 = vmaxsd_avx(auVar14,auVar17);
              if (local_a8 < dVar13) {
                uVar11 = uVar12;
              }
              uVar12 = (ulong)((int)uVar12 + 1);
              local_a8 = auVar14._0_8_;
            }
            (*(local_80->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
              _vptr_JointPolicy[0x10])(local_80,(ulong)optimizingAgentI,uVar10,uVar11);
            dVar13 = local_78 + local_a8;
            uVar10 = (ulong)((int)uVar10 + 1);
            puVar9 = (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      ((long)this_00 + 0x98))->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar11 = local_88;
          } while (local_88 <
                   (ulong)((long)(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  ((long)this_00 + 0x98))->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 3));
        }
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar11);
      }
      __x = BayesianGameBase::JointToIndividualTypeIndices
                      (&this_00->super_BayesianGameBase,(Index)uVar10);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,__x);
      if ((ulong)((long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar11) break;
      uVar3 = *(uint *)((long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + uVar11 * 4);
      (*(this_00->super_BayesianGameBase).super_Interface_ProblemToPolicyDiscretePure.
        super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[0xd])
                (this_00,uVar10);
      local_a8 = auVar15._0_8_;
      jointI = (*(local_80->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
                 super_JointPolicy._vptr_JointPolicy[0x11])(local_80,uVar10);
      IndexTools::JointToIndividualIndicesStepSize
                (&local_70,jointI,*(size_t **)((long)this_00 + 200),
                 *(size_t *)((long)this_00 + 0x78));
      uVar11 = 0;
      while( true ) {
        iVar6 = (*(this_00->super_BayesianGameBase).super_Interface_ProblemToPolicyDiscretePure.
                  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[4]
                )(this_00,(ulong)optimizingAgentI);
        auVar14 = auVar15._0_16_;
        if (CONCAT44(extraout_var_00,iVar6) <= uVar11) break;
        if ((ulong)((long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2) <= local_88) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[local_88] = (uint)uVar11;
        uVar7 = (*(this_00->super_BayesianGameBase).super_Interface_ProblemToPolicyDiscretePure.
                  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[7]
                )(this_00,&local_70);
        (*(this_00->super_BayesianGameBase).super_Interface_ProblemToPolicyDiscretePure.
          super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[0x10])
                  (this_00,uVar10,(ulong)uVar7);
        pdVar5 = local_48.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar3].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = local_a8;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = pdVar5[uVar11];
        auVar14 = vfmadd213sd_fma(auVar14,auVar16,auVar2);
        auVar15 = ZEXT1664(auVar14);
        pdVar5[uVar11] = auVar14._0_8_;
        uVar11 = (ulong)((uint)uVar11 + 1);
      }
      if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar11 = local_88;
      if (local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar10 = (ulong)((Index)uVar10 + 1);
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar11);
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar11);
}

Assistant:

double ComputeBestResponse(JP & jpolBG, 
            Index optimizingAgentI)
        {
            if(DEBUG_CBR)
            {
                std::cout << "ComputeBestResponse called - current jpolBG:"<<std::endl;
                jpolBG.Print();
                std::cout << "value="<<this->Evaluate(jpolBG)<<std::endl;
            }
            boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> bgip=
                this->GetBGIPI();
            const BayesianGameIdenticalPayoffInterface* bgipRawPtr=bgip.get();
            Index agI = optimizingAgentI;
            std::vector< std::vector<double> > v (bgip->GetNrTypes(agI), std::vector<double>(
                                            bgipRawPtr->GetNrActions(agI), 0.0) );
    
            if(DEBUG_CBR)
                std::cout << "ComputeBestResponse: compute all type-action values for agent agI..."<<std::endl;
            //compute all type-action values for agent agI
            for(Index jt = 0; jt < bgipRawPtr->GetNrJointTypes(); jt++)
            {
                std::vector<Index> types = bgipRawPtr->JointToIndividualTypeIndices(jt);
                Index type = types.at(agI);
                double jtProb = bgipRawPtr->GetProbability(jt);
                Index jaI = jpolBG.GetJointActionIndex(jt);
                std::vector<Index> avec = bgipRawPtr->JointToIndividualActionIndices(jaI);
                for(Index acI =0 ; acI < bgipRawPtr->GetNrActions(agI); acI++)
                {
                    avec.at(agI) = acI;
                    Index jaInew = bgipRawPtr->IndividualToJointActionIndices(avec);
                    double u =  bgipRawPtr->GetUtility(jt, jaInew);
                    v[type][acI] +=  jtProb * u;
                    if(DEBUG_CBR)
                        std::cout << "updated v[type][acI]="<<v[type][acI]<< 
                            "(jtProb=" << jtProb << ", u=" << u <<")" <<std::endl;
                }
            }
            if(DEBUG_CBR)
                std::cout << "ComputeBestResponse: compute the best response and value..."<<std::endl;
            //compute the best response and value
            double v_best = 0.0;
            for(Index type = 0; type < bgipRawPtr->GetNrTypes(agI); type++)
            {
                double v_t = -DBL_MAX;
                Index best_a = 0;
                for(Index acI = 0; acI < bgipRawPtr->GetNrActions(agI); acI++)
                {
                    double v_t_a = v[type][acI];
                    if(v_t_a > v_t)
                    {
                        best_a = acI;
                        v_t = v_t_a;
                    }
                }
                v_best += v_t;
                jpolBG.SetAction(agI, type, best_a);
            }
            return v_best;
        }